

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::H2V1ConvertFiltered(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint8 uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  
  iVar8 = this->m_image_x_size;
  puVar5 = this->m_pScan_line_0;
  uVar14 = (iVar8 >> 1) - 1;
  uVar11 = (this->m_max_mcu_y_size - this->m_mcu_lines_left) * 8;
  uVar12 = 0;
  uVar18 = 0;
  for (uVar16 = 0; uVar15 = (uint)uVar16, (int)uVar15 < iVar8; uVar16 = uVar16 + 1) {
    puVar6 = this->m_pSample_buf;
    iVar8 = check_sample_buf_ofs(this,(uVar15 & 7 | uVar11) + (uVar18 & 0x40 | uVar12 & 0xffffff00))
    ;
    uVar19 = (int)(uVar15 - 1) >> 1;
    uVar7 = uVar19 + 1;
    if ((int)uVar14 <= (int)(uVar19 + 1)) {
      uVar7 = uVar14;
    }
    bVar1 = puVar6[iVar8];
    if ((int)uVar19 < 1) {
      uVar19 = 0;
    }
    iVar20 = (uVar19 & 7 | (uVar19 & 0xfffffff8) << 5) + uVar11;
    puVar6 = this->m_pSample_buf;
    iVar8 = check_sample_buf_ofs(this,iVar20 + 0x80);
    bVar2 = puVar6[iVar8];
    puVar6 = this->m_pSample_buf;
    iVar8 = check_sample_buf_ofs(this,iVar20 + 0xc0);
    bVar3 = puVar6[iVar8];
    iVar20 = (uVar7 & 7 | (uVar7 & 0xfffffff8) << 5) + uVar11;
    puVar6 = this->m_pSample_buf;
    iVar8 = check_sample_buf_ofs(this,iVar20 + 0x80);
    bVar4 = puVar6[iVar8];
    puVar6 = this->m_pSample_buf;
    iVar20 = check_sample_buf_ofs(this,iVar20 + 0xc0);
    iVar8 = (uVar15 & 1) * 2 + 1;
    iVar17 = (uint)((uVar16 & 1) == 0) * 2 + 1;
    uVar13 = (ulong)((uint)puVar6[iVar20] * iVar17 + (uint)bVar3 * iVar8 + 2 & 0xffc);
    uVar9 = (ulong)((uint)bVar2 * iVar8 + (uint)bVar4 * iVar17 + 2 & 0xffc);
    iVar8 = *(int *)((long)this->m_crr + uVar13) + (uint)bVar1;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    uVar10 = (uint8)iVar8;
    if (0xfe < iVar8) {
      uVar10 = 0xff;
    }
    iVar8 = (*(int *)((long)this->m_cbg + uVar9) + *(int *)((long)this->m_crg + uVar13) >> 0x10) +
            (uint)bVar1;
    iVar20 = (uint)bVar1 + *(int *)((long)this->m_cbb + uVar9);
    puVar5[uVar16 * 4] = uVar10;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    if (0xfe < iVar8) {
      iVar8 = 0xff;
    }
    puVar5[uVar16 * 4 + 1] = (uint8)iVar8;
    if (iVar20 < 1) {
      iVar20 = 0;
    }
    if (0xfe < iVar20) {
      iVar20 = 0xff;
    }
    puVar5[uVar16 * 4 + 2] = (uint8)iVar20;
    puVar5[uVar16 * 4 + 3] = 0xff;
    iVar8 = this->m_image_x_size;
    uVar18 = uVar18 + 8;
    uVar12 = uVar12 + 0x10;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 4;
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;
		const int row_x8 = row * 8;

		for (int x = 0; x < m_image_x_size; x++)
		{
			int y = m_pSample_buf[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + row_x8)];

			int c_x0 = (x - 1) >> 1;
			int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
			c_x0 = JPGD_MAX(c_x0, 0);

			int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7) + row_x8 + 128;
			int cb0 = m_pSample_buf[check_sample_buf_ofs(a)];
			int cr0 = m_pSample_buf[check_sample_buf_ofs(a + 64)];

			int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7) + row_x8 + 128;
			int cb1 = m_pSample_buf[check_sample_buf_ofs(b)];
			int cr1 = m_pSample_buf[check_sample_buf_ofs(b + 64)];

			int w0 = (x & 1) ? 3 : 1;
			int w1 = (x & 1) ? 1 : 3;

			int cb = (cb0 * w0 + cb1 * w1 + 2) >> 2;
			int cr = (cr0 * w0 + cr1 * w1 + 2) >> 2;

			int rc = m_crr[cr];
			int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
			int bc = m_cbb[cb];

			d0[0] = clamp(y + rc);
			d0[1] = clamp(y + gc);
			d0[2] = clamp(y + bc);
			d0[3] = 255;

			d0 += 4;
		}
	}